

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::get_timeseries_config_string_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Options *opts)

{
  bool bVar1;
  string local_70;
  undefined1 local_50 [8];
  string tsopts;
  allocator<char> local_1a;
  byte local_19;
  _anonymous_namespace_ *local_18;
  Options *opts_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  opts_local = (Options *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"spot.timeseries(",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::__cxx11::string::string((string *)local_50);
  bVar1 = cali::ConfigManager::Options::is_set((Options *)local_18,"timeseries.metrics");
  if (bVar1) {
    cali::ConfigManager::Options::get_abi_cxx11_
              (&local_70,(Options *)local_18,"timeseries.metrics","");
    std::__cxx11::string::append((string *)local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  anon_unknown.dwarf_433838::convert_timeseries_option
            ((Options *)local_18,"iteration_interval",(string *)local_50);
  anon_unknown.dwarf_433838::convert_timeseries_option
            ((Options *)local_18,"time_interval",(string *)local_50);
  anon_unknown.dwarf_433838::convert_timeseries_option
            ((Options *)local_18,"target_loops",(string *)local_50);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_19 = 1;
  std::__cxx11::string::~string((string *)local_50);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_timeseries_config_string(const ConfigManager::Options& opts)
{
    std::string ret = "spot.timeseries(";
    std::string tsopts;

    if (opts.is_set("timeseries.metrics"))
        tsopts.append(opts.get("timeseries.metrics"));

    convert_timeseries_option(opts, "iteration_interval", tsopts);
    convert_timeseries_option(opts, "time_interval", tsopts);
    convert_timeseries_option(opts, "target_loops", tsopts);

    ret.append(tsopts);
    ret.append(")");

    return ret;
}